

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtype.cpp
# Opt level: O2

uchar * __thiscall vm_val_t::get_as_codeptr(vm_val_t *this)

{
  if (this->typ - VM_CODEOFS < 2) {
    return (uchar *)(G_code_pool_X.super_CVmPoolPaged.pages_
                     [(this->val).obj >>
                      ((byte)G_code_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem +
                    (G_code_pool_X.super_CVmPoolPaged._8_4_ - 1 & (this->val).obj));
  }
  if (this->typ == VM_CODEPTR) {
    return (uchar *)(this->val).ptr;
  }
  return (uchar *)0x0;
}

Assistant:

const uchar *vm_val_t::get_as_codeptr(VMG0_) const
{
    /* check my type */
    switch (typ)
    {
    case VM_CODEOFS:
    case VM_FUNCPTR:
        /* 
         *   these types contain code pool offsets - translate the offset to
         *   a physical pointer 
         */
        return (const uchar *)G_code_pool->get_ptr(val.ofs);

    case VM_CODEPTR:
        /* it's already a physical code pointer */
        return (const uchar *)val.ptr;
        
    default:
        /* other types do not contain code pointers */
        return 0;
    }
}